

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRErrorCorrectionLevel.cpp
# Opt level: O0

ErrorCorrectionLevel ZXing::QRCode::ECLevelFromBits(int bits,bool isMicro)

{
  ErrorCorrectionLevel LEVEL_FOR_BITS [4];
  ErrorCorrectionLevel LEVEL_FOR_BITS_1 [8];
  bool isMicro_local;
  int bits_local;
  ErrorCorrectionLevel local_4;
  
  if (isMicro) {
    LEVEL_FOR_BITS_1[0] = Low;
    LEVEL_FOR_BITS_1[1] = Low;
    LEVEL_FOR_BITS_1[2] = Medium;
    LEVEL_FOR_BITS_1[3] = Low;
    LEVEL_FOR_BITS_1[4] = Medium;
    LEVEL_FOR_BITS_1[5] = Low;
    LEVEL_FOR_BITS_1[6] = Medium;
    LEVEL_FOR_BITS_1[7] = Quality;
    local_4 = LEVEL_FOR_BITS_1[(int)(bits & 7)];
  }
  else {
    LEVEL_FOR_BITS[0] = Medium;
    LEVEL_FOR_BITS[1] = Low;
    LEVEL_FOR_BITS[2] = High;
    LEVEL_FOR_BITS[3] = Quality;
    local_4 = LEVEL_FOR_BITS[(int)(bits & 3)];
  }
  return local_4;
}

Assistant:

ErrorCorrectionLevel ECLevelFromBits(int bits, const bool isMicro)
{
	if (isMicro) {
		constexpr ErrorCorrectionLevel LEVEL_FOR_BITS[] = {
			ErrorCorrectionLevel::Low,    ErrorCorrectionLevel::Low, ErrorCorrectionLevel::Medium, ErrorCorrectionLevel::Low,
			ErrorCorrectionLevel::Medium, ErrorCorrectionLevel::Low, ErrorCorrectionLevel::Medium, ErrorCorrectionLevel::Quality};
		return LEVEL_FOR_BITS[bits & 0x07];
	}
	constexpr ErrorCorrectionLevel LEVEL_FOR_BITS[] = {ErrorCorrectionLevel::Medium, ErrorCorrectionLevel::Low,
													   ErrorCorrectionLevel::High, ErrorCorrectionLevel::Quality};
	return LEVEL_FOR_BITS[bits & 0x3];
}